

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

errr finish_parse_unarmed_blow(parser *p)

{
  unarmed_blow *puVar1;
  int iVar2;
  unarmed_blow *puVar3;
  wchar_t local_24;
  wchar_t i;
  unarmed_blow *next;
  unarmed_blow *blow;
  parser *p_local;
  
  next = (unarmed_blow *)parser_priv(p);
  num_unarmed_blows = L'\0';
  for (; next != (unarmed_blow *)0x0; next = next->next) {
    num_unarmed_blows = num_unarmed_blows + L'\x01';
  }
  unarmed_blows = (unarmed_blow *)mem_zalloc((long)num_unarmed_blows * 0x18);
  next = (unarmed_blow *)parser_priv(p);
  local_24 = num_unarmed_blows;
  while (local_24 = local_24 + L'\xffffffff', L'\xffffffff' < local_24) {
    puVar1 = next->next;
    puVar3 = unarmed_blows + local_24;
    puVar3->name = next->name;
    iVar2 = next->ds;
    puVar3->dd = next->dd;
    puVar3->ds = iVar2;
    puVar3->next = next->next;
    mem_free(next);
    next = puVar1;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_unarmed_blow(struct parser *p) {
	struct unarmed_blow *blow = parser_priv(p), *next;
	int i;

	/* Count the blows */
	num_unarmed_blows = 0;
	while (blow) {
		blow = blow->next;
		num_unarmed_blows++;
	}

	/* Allocate the array */
	unarmed_blows = mem_zalloc(num_unarmed_blows * sizeof(struct unarmed_blow));
	blow = parser_priv(p);
	for (i = num_unarmed_blows - 1; i >= 0; i--) {
		next = blow->next;
		memcpy(&unarmed_blows[i], blow, sizeof(*blow));
		mem_free(blow);
		blow = next;
	}

	parser_destroy(p);
	return 0;
}